

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O1

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *v)

{
  ulong uVar1;
  pointer pPVar2;
  long lVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pPVar2 = (v->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar2) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      operator<<(os,(Payload *)((long)&(pPVar2->asset_path).asset_path_._M_dataplus._M_p + lVar3));
      if (uVar1 != ((long)(v->
                          super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(v->
                          super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x71c71c71c71c71c7 - 1U
         ) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar1 = uVar1 + 1;
      pPVar2 = (v->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x120;
    } while (uVar1 < (ulong)(((long)(v->
                                    super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 5)
                            * -0x71c71c71c71c71c7));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}